

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voice.h
# Opt level: O0

void __thiscall Voice::Voice(Voice *this)

{
  __pointer_type in_RDI;
  allocator_type *unaff_retaddr;
  size_type in_stack_00000008;
  atomic<VoicePropsItem_*> *in_stack_fffffffffffffff0;
  
  std::atomic<VoicePropsItem_*>::atomic(in_stack_fffffffffffffff0,in_RDI);
  std::atomic<unsigned_int>::atomic
            ((atomic<unsigned_int> *)in_stack_fffffffffffffff0,
             (__integral_type)((ulong)in_RDI >> 0x20));
  std::atomic<Voice::State>::atomic
            ((atomic<Voice::State> *)&in_RDI[1].super_VoiceProps.Gain,Stopped);
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_fffffffffffffff0,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI[1].super_VoiceProps.Velocity._M_elems[2] = 0.0;
  in_RDI[1].super_VoiceProps.OrientUp._M_elems[2] = 0.0;
  *(undefined4 *)&in_RDI[1].super_VoiceProps.HeadRelative = 0;
  TargetData::TargetData((TargetData *)0x19f5cf);
  std::array<Voice::TargetData,_6UL>::array((array<Voice::TargetData,_6UL> *)unaff_retaddr);
  std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::vector
            ((vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> *)this,
             in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

Voice() = default;